

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

Status cmSystemTools::CreateLink(string *origName,string *newName)

{
  Status status;
  Status local_c0;
  string local_b8;
  string local_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  local_c0 = CreateLinkQuietly(origName,newName);
  if (local_c0.Kind_ != Success) {
    local_48.View_._M_len = 0x17;
    local_48.View_._M_str = "failed to create link \'";
    local_78.View_._M_str = (newName->_M_dataplus)._M_p;
    local_78.View_._M_len = newName->_M_string_length;
    cmsys::Status::GetString_abi_cxx11_(&local_98,&local_c0);
    cmStrCat<char[4],std::__cxx11::string>
              (&local_b8,&local_48,&local_78,(char (*) [4])0x5b1288,&local_98);
    Error(&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return local_c0;
}

Assistant:

cmsys::Status cmSystemTools::CreateLink(std::string const& origName,
                                        std::string const& newName)
{
  cmsys::Status status = cmSystemTools::CreateLinkQuietly(origName, newName);
  if (!status) {
    cmSystemTools::Error(
      cmStrCat("failed to create link '", newName, "': ", status.GetString()));
  }
  return status;
}